

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O2

bool __thiscall QWidgetLineControl::fixup(QWidgetLineControl *this)

{
  bool bVar1;
  int iVar2;
  long in_FS_OFFSET;
  int cursorCopy;
  int local_3c;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QPointer::operator_cast_to_bool((QPointer *)(this + 0xa8));
  if (bVar1) {
    local_38.d = *(Data **)(this + 0x18);
    local_38.ptr = *(char16_t **)(this + 0x20);
    local_38.size = *(qsizetype *)(this + 0x28);
    if (local_38.d != (Data *)0x0) {
      LOCK();
      ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_3c = *(int *)(this + 0x40);
    (**(code **)(**(long **)(this + 0xb0) + 0x68))(*(long **)(this + 0xb0),&local_38);
    iVar2 = (**(code **)(**(long **)(this + 0xb0) + 0x60))
                      (*(long **)(this + 0xb0),&local_38,&local_3c);
    if (iVar2 == 2) {
      bVar1 = ::operator!=((QString *)&local_38,(QString *)(this + 0x18));
      if ((bVar1) || (local_3c != *(int *)(this + 0x40))) {
        internalSetText(this,(QString *)&local_38,local_3c,false);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
      bVar1 = true;
      goto LAB_003f667b;
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  }
  bVar1 = false;
LAB_003f667b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QWidgetLineControl::fixup() // this function assumes that validate currently returns != Acceptable
{
#ifndef QT_NO_VALIDATOR
    if (m_validator) {
        QString textCopy = m_text;
        int cursorCopy = m_cursor;
        m_validator->fixup(textCopy);
        if (m_validator->validate(textCopy, cursorCopy) == QValidator::Acceptable) {
            if (textCopy != m_text || cursorCopy != m_cursor)
                internalSetText(textCopy, cursorCopy, false);
            return true;
        }
    }
#endif
    return false;
}